

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

UStringTrieResult __thiscall
icu_63::BytesTrie::branchNext(BytesTrie *this,uint8_t *pos,int32_t length,int32_t inByte)

{
  byte bVar1;
  UStringTrieResult UVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  
  if (length == 0) {
    length = (int32_t)*pos;
    pos = pos + 1;
  }
  uVar5 = length + 1;
  pbVar3 = pos;
  if (4 < length) {
    do {
      if (inByte < (int)(uint)*pbVar3) {
        pos = jumpByDelta(pbVar3 + 1);
        uVar5 = uVar5 >> 1;
      }
      else {
        uVar5 = uVar5 - (uVar5 >> 1);
        pos = pbVar3 + 2;
        bVar1 = pbVar3[1];
        if (0xbf < bVar1) {
          if (bVar1 < 0xf0) {
            pos = pbVar3 + 3;
          }
          else if (bVar1 < 0xfe) {
            pos = pbVar3 + 4;
          }
          else {
            pos = pos + (ulong)(bVar1 & 1) + 3;
          }
        }
      }
      pbVar3 = pos;
    } while (5 < (int)uVar5);
  }
  iVar6 = uVar5 + 1;
  do {
    if ((uint)*pos == inByte) {
      pbVar3 = pos + 1;
      bVar1 = *pbVar3;
      UVar2 = USTRINGTRIE_FINAL_VALUE;
      if ((bVar1 & 1) == 0) {
        if (bVar1 < 0xa2) {
          pbVar4 = pos + 2;
          uVar5 = (bVar1 >> 1) - 0x10;
        }
        else if (bVar1 < 0xd8) {
          pbVar4 = pos + 3;
          uVar5 = ((uint)bVar1 * 0x80 + (uint)pos[2]) - 0x5100;
        }
        else if (bVar1 < 0xfc) {
          uVar5 = ((uint)pos[3] + (uint)pos[2] * 0x100 + (uint)bVar1 * 0x8000) - 0x6c0000;
          pbVar4 = pos + 4;
        }
        else if (bVar1 == 0xfc) {
          uVar5 = (uint)pos[3] << 8 | (uint)pos[2] << 0x10 | (uint)pos[4];
          pbVar4 = pos + 5;
        }
        else {
          uVar5 = (uint)pos[5] | (uint)pos[4] << 8 | (uint)pos[3] << 0x10 | (uint)pos[2] << 0x18;
          pbVar4 = pos + 6;
        }
        pbVar3 = pbVar4 + (int)uVar5;
        UVar2 = USTRINGTRIE_NO_VALUE;
        if (0x1f < pbVar4[(int)uVar5]) {
          UVar2 = pbVar4[(int)uVar5] & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
        }
      }
      this->pos_ = pbVar3;
      return UVar2;
    }
    pbVar3 = pos + 2;
    bVar1 = pos[1];
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        pbVar3 = pos + 3;
      }
      else if (bVar1 < 0xfc) {
        pbVar3 = pos + 4;
      }
      else {
        pbVar3 = pos + (ulong)((bVar1 >> 1 & 1) != 0) + 5;
      }
    }
    iVar6 = iVar6 + -1;
    pos = pbVar3;
  } while (2 < iVar6);
  if ((uint)*pbVar3 == inByte) {
    this->pos_ = pbVar3 + 1;
    UVar2 = USTRINGTRIE_NO_VALUE;
    if (0x1f < pbVar3[1]) {
      UVar2 = pbVar3[1] & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
    }
  }
  else {
    this->pos_ = (uint8_t *)0x0;
    UVar2 = USTRINGTRIE_NO_MATCH;
  }
  return UVar2;
}

Assistant:

UStringTrieResult
BytesTrie::branchNext(const uint8_t *pos, int32_t length, int32_t inByte) {
    // Branch according to the current byte.
    if(length==0) {
        length=*pos++;
    }
    ++length;
    // The length of the branch is the number of bytes to select from.
    // The data structure encodes a binary search.
    while(length>kMaxBranchLinearSubNodeLength) {
        if(inByte<*pos++) {
            length>>=1;
            pos=jumpByDelta(pos);
        } else {
            length=length-(length>>1);
            pos=skipDelta(pos);
        }
    }
    // Drop down to linear search for the last few bytes.
    // length>=2 because the loop body above sees length>kMaxBranchLinearSubNodeLength>=3
    // and divides length by 2.
    do {
        if(inByte==*pos++) {
            UStringTrieResult result;
            int32_t node=*pos;
            U_ASSERT(node>=kMinValueLead);
            if(node&kValueIsFinal) {
                // Leave the final value for getValue() to read.
                result=USTRINGTRIE_FINAL_VALUE;
            } else {
                // Use the non-final value as the jump delta.
                ++pos;
                // int32_t delta=readValue(pos, node>>1);
                node>>=1;
                int32_t delta;
                if(node<kMinTwoByteValueLead) {
                    delta=node-kMinOneByteValueLead;
                } else if(node<kMinThreeByteValueLead) {
                    delta=((node-kMinTwoByteValueLead)<<8)|*pos++;
                } else if(node<kFourByteValueLead) {
                    delta=((node-kMinThreeByteValueLead)<<16)|(pos[0]<<8)|pos[1];
                    pos+=2;
                } else if(node==kFourByteValueLead) {
                    delta=(pos[0]<<16)|(pos[1]<<8)|pos[2];
                    pos+=3;
                } else {
                    delta=(pos[0]<<24)|(pos[1]<<16)|(pos[2]<<8)|pos[3];
                    pos+=4;
                }
                // end readValue()
                pos+=delta;
                node=*pos;
                result= node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
            }
            pos_=pos;
            return result;
        }
        --length;
        pos=skipValue(pos);
    } while(length>1);
    if(inByte==*pos++) {
        pos_=pos;
        int32_t node=*pos;
        return node>=kMinValueLead ? valueResult(node) : USTRINGTRIE_NO_VALUE;
    } else {
        stop();
        return USTRINGTRIE_NO_MATCH;
    }
}